

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void readtable(void)

{
  int iVar1;
  char *pcVar2;
  char local_115 [8];
  char filename [13];
  char *ttype [3];
  undefined8 local_e8;
  char *name [6];
  char strnull [10];
  float den [6];
  float floatnull;
  long dia [6];
  undefined8 local_50;
  long longnull;
  long nelem;
  long felem;
  long frow;
  int ii;
  int anynull;
  int nfound;
  int hdutype;
  int hdunum;
  int status;
  fitsfile *fptr;
  
  builtin_strncpy(local_115,"atestfil",8);
  builtin_strncpy(filename,".fit",5);
  hdutype = 0;
  iVar1 = ffopentest(10,&hdunum,local_115,0,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  for (frow._0_4_ = 0; (int)frow < 3; frow._0_4_ = (int)frow + 1) {
    pcVar2 = (char *)malloc(0x47);
    ttype[(long)(int)frow + -1] = pcVar2;
  }
  for (frow._0_4_ = 0; (int)frow < 6; frow._0_4_ = (int)frow + 1) {
    pcVar2 = (char *)malloc(10);
    name[(long)(int)frow + -1] = pcVar2;
  }
  for (nfound = 2; nfound < 4; nfound = nfound + 1) {
    iVar1 = ffmahd(_hdunum,nfound,&anynull,&hdutype);
    if (iVar1 != 0) {
      printerror(hdutype);
    }
    if (anynull == 1) {
      printf("\nReading ASCII table in HDU %d:\n",(ulong)(uint)nfound);
    }
    else if (anynull == 2) {
      printf("\nReading binary table in HDU %d:\n",(ulong)(uint)nfound);
    }
    else {
      printf("Error: this HDU is not an ASCII or binary table\n");
      printerror(hdutype);
    }
    ffgkns(_hdunum,"TTYPE",1,3,filename + 5,&ii,&hdutype);
    printf(" Row  %10s %10s %10s\n",filename._5_8_,ttype[0],ttype[1]);
    felem = 1;
    nelem = 1;
    longnull = 6;
    strcpy((char *)((long)name + 0x2e)," ");
    local_50 = 0;
    den[5] = 0.0;
    ffgcv(_hdunum,0x10,1,felem,nelem,longnull,(long)name + 0x2e,&local_e8,(long)&frow + 4,&hdutype);
    ffgcv(_hdunum,0x29,2,felem,nelem,longnull,&local_50,&stack0xffffffffffffff78,(long)&frow + 4,
          &hdutype);
    ffgcv(_hdunum,0x2a,3,felem,nelem,longnull,den + 5,strnull + 2,(long)&frow + 4,&hdutype);
    for (frow._0_4_ = 0; (int)frow < 6; frow._0_4_ = (int)frow + 1) {
      printf("%5d %10s %10ld %10.2f\n",(double)den[(long)(int)frow + -2],(ulong)((int)frow + 1),
             name[(long)(int)frow + -1],
             *(undefined8 *)(&stack0xffffffffffffff78 + (long)(int)frow * 8));
    }
  }
  for (frow._0_4_ = 0; (int)frow < 3; frow._0_4_ = (int)frow + 1) {
    free(ttype[(long)(int)frow + -1]);
  }
  for (frow._0_4_ = 0; (int)frow < 6; frow._0_4_ = (int)frow + 1) {
    free(name[(long)(int)frow + -1]);
  }
  iVar1 = ffclos(_hdunum,&hdutype);
  if (iVar1 != 0) {
    printerror(hdutype);
  }
  return;
}

Assistant:

void readtable( void )

    /************************************************************/
    /* read and print data values from an ASCII or binary table */
    /************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status, hdunum, hdutype,  nfound, anynull, ii;
    long frow, felem, nelem, longnull, dia[6];
    float floatnull, den[6];
    char strnull[10], *name[6], *ttype[3]; 

    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) )
         printerror( status );

    for (ii = 0; ii < 3; ii++)      /* allocate space for the column labels */
        ttype[ii] = (char *) malloc(FLEN_VALUE);  /* max label length = 69 */

    for (ii = 0; ii < 6; ii++)    /* allocate space for string column value */
        name[ii] = (char *) malloc(10);   

    for (hdunum = 2; hdunum <= 3; hdunum++) /*read ASCII, then binary table */
    {
      /* move to the HDU */
      if ( fits_movabs_hdu(fptr, hdunum, &hdutype, &status) ) 
           printerror( status );

      if (hdutype == ASCII_TBL)
          printf("\nReading ASCII table in HDU %d:\n",  hdunum);
      else if (hdutype == BINARY_TBL)
          printf("\nReading binary table in HDU %d:\n", hdunum);
      else
      {
          printf("Error: this HDU is not an ASCII or binary table\n");
          printerror( status );
      }

      /* read the column names from the TTYPEn keywords */
      fits_read_keys_str(fptr, "TTYPE", 1, 3, ttype, &nfound, &status);

      printf(" Row  %10s %10s %10s\n", ttype[0], ttype[1], ttype[2]);

      frow      = 1;
      felem     = 1;
      nelem     = 6;
      strcpy(strnull, " ");
      longnull  = 0;
      floatnull = 0.;

      /*  read the columns */  
      fits_read_col(fptr, TSTRING, 1, frow, felem, nelem, strnull,  name,
                    &anynull, &status);
      fits_read_col(fptr, TLONG, 2, frow, felem, nelem, &longnull,  dia,
                    &anynull, &status);
      fits_read_col(fptr, TFLOAT, 3, frow, felem, nelem, &floatnull, den,
                    &anynull, &status);

      for (ii = 0; ii < 6; ii++)
        printf("%5d %10s %10ld %10.2f\n", ii + 1, name[ii], dia[ii], den[ii]);
    }

    for (ii = 0; ii < 3; ii++)      /* free the memory for the column labels */
        free( ttype[ii] );

    for (ii = 0; ii < 6; ii++)      /* free the memory for the string column */
        free( name[ii] );

    if ( fits_close_file(fptr, &status) ) 
         printerror( status );

    return;
}